

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::
     local_exscan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
               (int *begin,int *end)

{
  int iVar1;
  T tmp;
  int iVar2;
  
  if (end != begin) {
    iVar2 = *begin;
    *begin = 0;
    for (begin = begin + 1; begin != end; begin = begin + 1) {
      iVar1 = *begin;
      *begin = iVar2;
      iVar2 = iVar1 + iVar2;
    }
  }
  return;
}

Assistant:

void local_exscan_inplace(Iterator begin, Iterator end, Func func) {
    // return if there's nothing here
    if (std::distance(begin, end) == 0)
        return;
    typedef typename std::iterator_traits<Iterator>::value_type T;

    // start from first element
    T val = *begin;
    *begin = T();
    ++begin;

    // calculate the exclusive prefix sum
    while (begin != end) {
        T tmp = val;
        val = func(val,*begin);
        *begin = tmp;
        ++begin;
    }
}